

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_Login(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_USER_TYPE userType,CK_UTF8CHAR_PTR pPin
                ,CK_ULONG ulPinLen)

{
  SessionManager *this_00;
  bool bVar1;
  Session *this_01;
  Token *this_02;
  Slot *this_03;
  CK_SLOT_ID slotID;
  CK_RV CVar2;
  ByteString pin;
  ByteString local_58;
  
  CVar2 = 400;
  if (this->isInitialised == true) {
    this_01 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_01 == (Session *)0x0) {
      CVar2 = 0xb3;
    }
    else if (pPin == (CK_UTF8CHAR_PTR)0x0) {
      CVar2 = 7;
    }
    else {
      ByteString::ByteString(&local_58,pPin,ulPinLen);
      this_02 = Session::getToken(this_01);
      if (this_02 == (Token *)0x0) {
        CVar2 = 5;
      }
      else if (userType == 2) {
        bVar1 = Session::getReAuthentication(this_01);
        CVar2 = 0x91;
        if ((bVar1) && (CVar2 = Token::reAuthenticate(this_02,&local_58), CVar2 == 0)) {
          CVar2 = 0;
          Session::setReAuthentication(this_01,false);
        }
      }
      else if (userType == 1) {
        CVar2 = Token::loginUser(this_02,&local_58);
      }
      else {
        CVar2 = 0x103;
        if (userType == 0) {
          this_00 = this->sessionManager;
          this_03 = Session::getSlot(this_01);
          slotID = Slot::getSlotID(this_03);
          bVar1 = SessionManager::haveROSession(this_00,slotID);
          CVar2 = 0xb7;
          if (!bVar1) {
            CVar2 = Token::loginSO(this_02,&local_58);
          }
        }
      }
      local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_58.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    }
  }
  return CVar2;
}

Assistant:

CK_RV SoftHSM::C_Login(CK_SESSION_HANDLE hSession, CK_USER_TYPE userType, CK_UTF8CHAR_PTR pPin, CK_ULONG ulPinLen)
{
	CK_RV rv = CKR_OK;

	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the PIN
	if (pPin == NULL_PTR) return CKR_ARGUMENTS_BAD;
	ByteString pin(pPin, ulPinLen);

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	switch (userType)
	{
		case CKU_SO:
			// There cannot exist a R/O session on this slot
			if (sessionManager->haveROSession(session->getSlot()->getSlotID())) return CKR_SESSION_READ_ONLY_EXISTS;

			// Login
			rv = token->loginSO(pin);
			break;
		case CKU_USER:
			// Login
			rv = token->loginUser(pin);
			break;
		case CKU_CONTEXT_SPECIFIC:
			// Check if re-authentication is required
			if (!session->getReAuthentication()) return CKR_OPERATION_NOT_INITIALIZED;

			// Re-authenticate
			rv = token->reAuthenticate(pin);
			if (rv == CKR_OK) session->setReAuthentication(false);
			break;
		default:
			return CKR_USER_TYPE_INVALID;
	}

	return rv;
}